

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

char * transform_schema2json(lys_module *module,char *expr)

{
  size_t sVar1;
  LY_ERR *pLVar2;
  lyxp_expr *expr_00;
  char *s;
  char *pcVar3;
  long lVar4;
  lys_module *plVar5;
  ushort **ppuVar6;
  char *pcVar7;
  bool bVar8;
  lyxp_expr *exp;
  lys_module *mod;
  size_t pref_len;
  size_t out_used;
  size_t out_size;
  char *pcStack_40;
  uint16_t i;
  char *out;
  char *ptr;
  char *cur_expr;
  char *end;
  char *expr_local;
  lys_module *module_local;
  
  sVar1 = strlen(expr);
  out_used = sVar1 + 1;
  pcStack_40 = (char *)malloc(out_used);
  if (pcStack_40 == (char *)0x0) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_schema2json");
    module_local = (lys_module *)0x0;
  }
  else {
    pref_len = 0;
    expr_00 = lyxp_parse_expr(expr);
    if (expr_00 == (lyxp_expr *)0x0) {
LAB_0010fbef:
      free(pcStack_40);
      lyxp_expr_free(expr_00);
      module_local = (lys_module *)0x0;
    }
    else {
      for (out_size._6_2_ = 0; out_size._6_2_ < expr_00->used; out_size._6_2_ = out_size._6_2_ + 1)
      {
        s = expr_00->expr + expr_00->expr_pos[out_size._6_2_];
        if ((out_size._6_2_ != 0) &&
           (pcVar3 = expr_00->expr +
                     (long)(int)(uint)expr_00->tok_len[(int)(out_size._6_2_ - 1)] +
                     (long)(int)(uint)expr_00->expr_pos[(int)(out_size._6_2_ - 1)], pcVar3 != s)) {
          strncpy(pcStack_40 + pref_len,pcVar3,(long)s - (long)pcVar3);
          pref_len = (size_t)(s + (pref_len - (long)pcVar3));
        }
        if ((expr_00->tokens[out_size._6_2_] == LYXP_TOKEN_NAMETEST) &&
           (pcVar3 = strnchr(s,0x3a,(uint)expr_00->tok_len[out_size._6_2_]), pcVar3 != (char *)0x0))
        {
          lVar4 = (long)pcVar3 - (long)s;
          plVar5 = lys_get_import_module(module,s,(int)lVar4,(char *)0x0,0);
          if (plVar5 == (lys_module *)0x0) {
            ly_vlog(LYE_INMOD_LEN,LY_VLOG_NONE,(void *)0x0,lVar4,s);
            goto LAB_0010fbef;
          }
          sVar1 = strlen(plVar5->name);
          out_used = (sVar1 - lVar4) + out_used;
          pcStack_40 = (char *)ly_realloc(pcStack_40,out_used);
          if (pcStack_40 == (char *)0x0) {
            pLVar2 = ly_errno_location();
            *pLVar2 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_schema2json");
            goto LAB_0010fbef;
          }
          strcpy(pcStack_40 + pref_len,plVar5->name);
          sVar1 = strlen(plVar5->name);
          strncpy(pcStack_40 + sVar1 + pref_len,pcVar3,
                  (ulong)expr_00->tok_len[out_size._6_2_] - lVar4);
          pref_len = ((ulong)expr_00->tok_len[out_size._6_2_] - lVar4) + sVar1 + pref_len;
        }
        else if ((expr_00->tokens[out_size._6_2_] == LYXP_TOKEN_LITERAL) &&
                (pcVar3 = strnchr(s,0x3a,(uint)expr_00->tok_len[out_size._6_2_]), out = pcVar3,
                pcVar3 != (char *)0x0)) {
          while( true ) {
            ppuVar6 = __ctype_b_loc();
            bVar8 = true;
            if (((((*ppuVar6)[(int)out[-1]] & 8) == 0) && (bVar8 = true, out[-1] != '_')) &&
               (bVar8 = true, out[-1] != '-')) {
              bVar8 = out[-1] == '.';
            }
            if (!bVar8) break;
            out = out + -1;
          }
          lVar4 = (long)pcVar3 - (long)out;
          plVar5 = lys_get_import_module(module,out,(int)lVar4,(char *)0x0,0);
          if (plVar5 == (lys_module *)0x0) {
            strncpy(pcStack_40 + pref_len,expr_00->expr + expr_00->expr_pos[out_size._6_2_],
                    (ulong)expr_00->tok_len[out_size._6_2_]);
            pref_len = expr_00->tok_len[out_size._6_2_] + pref_len;
          }
          else {
            sVar1 = strlen(plVar5->name);
            out_used = (sVar1 - lVar4) + out_used;
            pcStack_40 = (char *)ly_realloc(pcStack_40,out_used);
            if (pcStack_40 == (char *)0x0) {
              pLVar2 = ly_errno_location();
              *pLVar2 = LY_EMEM;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_schema2json");
              goto LAB_0010fbef;
            }
            strncpy(pcStack_40 + pref_len,s,(long)out - (long)s);
            pcVar7 = out + (pref_len - (long)s);
            strcpy(pcStack_40 + (long)pcVar7,plVar5->name);
            sVar1 = strlen(plVar5->name);
            strncpy(pcStack_40 + (long)(pcVar7 + sVar1),pcVar3,
                    ((ulong)expr_00->tok_len[out_size._6_2_] - lVar4) - ((long)out - (long)s));
            pref_len = (size_t)(pcVar7 + sVar1 +
                               (((ulong)expr_00->tok_len[out_size._6_2_] - lVar4) -
                               ((long)out - (long)s)));
          }
        }
        else {
          strncpy(pcStack_40 + pref_len,expr_00->expr + expr_00->expr_pos[out_size._6_2_],
                  (ulong)expr_00->tok_len[out_size._6_2_]);
          pref_len = expr_00->tok_len[out_size._6_2_] + pref_len;
        }
      }
      pcStack_40[pref_len] = '\0';
      lyxp_expr_free(expr_00);
      module_local = (lys_module *)lydict_insert_zc(module->ctx,pcStack_40);
    }
  }
  return (char *)module_local;
}

Assistant:

const char *
transform_schema2json(const struct lys_module *module, const char *expr)
{
    const char *end, *cur_expr, *ptr;
    char *out;
    uint16_t i;
    size_t out_size, out_used, pref_len;
    const struct lys_module *mod;
    struct lyxp_expr *exp = NULL;

    out_size = strlen(expr) + 1;
    out = malloc(out_size);
    if (!out) {
        LOGMEM;
        return NULL;
    }
    out_used = 0;

    exp = lyxp_parse_expr(expr);
    if (!exp) {
        goto error;
    }

    for (i = 0; i < exp->used; ++i) {
        cur_expr = &exp->expr[exp->expr_pos[i]];

        /* copy WS */
        if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
            strncpy(&out[out_used], end, cur_expr - end);
            out_used += cur_expr - end;
        }

        if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            /* get the module */
            pref_len = end - cur_expr;
            mod = lys_get_import_module(module, cur_expr, pref_len, NULL, 0);
            if (!mod) {
                LOGVAL(LYE_INMOD_LEN, LY_VLOG_NONE, NULL, pref_len, cur_expr);
                goto error;
            }

            /* adjust out size (it can even decrease in some strange cases) */
            out_size += strlen(mod->name) - pref_len;
            out = ly_realloc(out, out_size);
            if (!out) {
                LOGMEM;
                goto error;
            }

            /* copy the model name */
            strcpy(&out[out_used], mod->name);
            out_used += strlen(mod->name);

            /* copy the rest */
            strncpy(&out[out_used], end, exp->tok_len[i] - pref_len);
            out_used += exp->tok_len[i] - pref_len;
        } else if ((exp->tokens[i] == LYXP_TOKEN_LITERAL) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            ptr = end;
            while (isalnum(ptr[-1]) || (ptr[-1] == '_') || (ptr[-1] == '-') || (ptr[-1] == '.')) {
                --ptr;
            }

            /* get the module */
            pref_len = end - ptr;
            mod = lys_get_import_module(module, ptr, pref_len, NULL, 0);
            if (mod) {
                /* adjust out size (it can even decrease in some strange cases) */
                out_size += strlen(mod->name) - pref_len;
                out = ly_realloc(out, out_size);
                if (!out) {
                    LOGMEM;
                    goto error;
                }

                /* copy any beginning */
                strncpy(&out[out_used], cur_expr, ptr - cur_expr);
                out_used += ptr - cur_expr;

                /* copy the model name */
                strcpy(&out[out_used], mod->name);
                out_used += strlen(mod->name);

                /* copy the rest */
                strncpy(&out[out_used], end, (exp->tok_len[i] - pref_len) - (ptr - cur_expr));
                out_used += (exp->tok_len[i] - pref_len) - (ptr - cur_expr);
            } else {
                strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                out_used += exp->tok_len[i];
            }
        } else {
            strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
            out_used += exp->tok_len[i];
        }
    }
    out[out_used] = '\0';

    lyxp_expr_free(exp);
    return lydict_insert_zc(module->ctx, out);

error:
    free(out);
    lyxp_expr_free(exp);
    return NULL;
}